

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
jessilib::json_parser::serialize_impl<char32_t,char32_t>
          (json_parser *this,
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *out_string,
          object *in_object)

{
  __index_type _Var1;
  object *poVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  invalid_argument *this_00;
  uint *puVar5;
  char8_t *pcVar6;
  pointer pcVar7;
  ulong uVar8;
  char8_t *pcVar9;
  object *obj;
  object *in_object_00;
  longdouble lVar10;
  u8string_view in_string;
  u8string_view in_string_00;
  basic_string_view<char32_t> format_str;
  basic_format_args<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
  args;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_68;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_48;
  
  if (serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)::
      s_null_array == '\0') {
    serialize_impl<char32_t,char32_t>();
  }
  if (serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)::
      s_null_map_abi_cxx11_ == '\0') {
    serialize_impl<char32_t,char32_t>();
  }
  _Var1 = *(__index_type *)
           ((long)&(in_object->m_value).
                   super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                   .
                   super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           + 0x30);
  puVar5 = &switchD_00168dfc::switchdataD_00197208;
  switch(_Var1) {
  case '\0':
    pcVar7 = (out_string->_M_dataplus)._M_p + out_string->_M_string_length;
    pcVar6 = "null";
    pcVar9 = "";
    goto LAB_00169053;
  case '\x01':
    pcVar7 = (out_string->_M_dataplus)._M_p + out_string->_M_string_length;
    if ((_Var1 == '\x01') &&
       ((*(byte *)&(in_object->m_value).
                   super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                   .
                   super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        & 1) != 0)) {
      pcVar6 = "true";
      pcVar9 = "";
    }
    else {
      pcVar6 = "false";
      pcVar9 = "";
    }
LAB_00169053:
    std::__cxx11::u32string::_M_replace_dispatch<char8_t_const*>
              ((u32string *)out_string,pcVar7,pcVar7,pcVar6,pcVar9);
    return;
  case '\x02':
    if (_Var1 == '\x02') {
      local_48._M_dataplus._M_p =
           *(pointer *)
            &(in_object->m_value).
             super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
             .
             super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
             .
             super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
             .
             super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
             .
             super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
             .
             super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ;
    }
    else {
      local_48._M_dataplus._M_p = (pointer)0x0;
    }
    format_str.size_ = 2;
    format_str.data_ = (char32_t *)empty_format_arg<char32_t>;
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_char32_t>_>
          *)&local_48;
    args.desc_ = 3;
    fmt::v8::vformat<char32_t,_0>(&local_68,format_str,args);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    _M_append(out_string,local_68._M_dataplus._M_p,local_68._M_string_length);
    break;
  case '\x03':
    lVar10 = (longdouble)0;
    if (_Var1 == '\x03') {
      lVar10 = *(longdouble *)
                &(in_object->m_value).
                 super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                 .
                 super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ;
    }
    local_48._M_dataplus._M_p = SUB108(lVar10,0);
    local_48._M_string_length._0_2_ = (undefined2)((unkuint10)lVar10 >> 0x40);
    fmt::v8::format<char32_t[3],_long_double,_char32_t,_0>
              (&local_68,(char32_t (*) [3])empty_format_arg<char32_t>,(longdouble *)&local_48);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    _M_append(out_string,local_68._M_dataplus._M_p,local_68._M_string_length);
    break;
  case '\x04':
    local_48._M_string_length._0_2_ = 0;
    local_48._M_string_length._2_6_ = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    object::
    get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
              ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
               &local_68,in_object,&local_48);
    in_string._M_str = (char8_t *)puVar5;
    in_string._M_len = (size_t)local_68._M_dataplus._M_p;
    make_json_string<char32_t,char32_t>
              ((jessilib *)out_string,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_68._M_string_length,in_string);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
    uVar8 = CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0])
            + 1;
    local_68._M_dataplus._M_p = (pointer)local_48._M_dataplus._M_p;
    goto LAB_001690ba;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              ((string *)&local_48,
               (long)(char)*(__index_type *)
                            ((long)&(in_object->m_value).
                                    super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                                    .
                                    super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            + 0x30));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                   "Invalid data type: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case '\x06':
    sVar3 = object::size(in_object);
    if (sVar3 == 0) {
      pcVar7 = (out_string->_M_dataplus)._M_p + out_string->_M_string_length;
      std::__cxx11::u32string::_M_replace_dispatch<char8_t_const*>
                ((u32string *)out_string,pcVar7,pcVar7,"[]","");
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(out_string,L'[');
    if (*(__index_type *)
         ((long)&(in_object->m_value).
                 super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                 .
                 super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
         + 0x30) != '\x06') {
      in_object = (object *)&serialize_impl<char32_t,_char32_t>::s_null_array;
    }
    poVar2 = *(object **)
              ((long)&(in_object->m_value).
                      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                      .
                      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
              + 8);
    for (in_object_00 = *(object **)
                         &(in_object->m_value).
                          super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                          .
                          super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ; in_object_00 != poVar2; in_object_00 = in_object_00 + 1) {
      serialize_impl<char32_t,char32_t>(this,out_string,in_object_00);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(out_string,L',');
    }
    (out_string->_M_dataplus)._M_p[out_string->_M_string_length - 1] = L']';
    return;
  case '\a':
    sVar3 = object::size(in_object);
    if (sVar3 == 0) {
      pcVar7 = (out_string->_M_dataplus)._M_p + out_string->_M_string_length;
      pcVar6 = "{}";
      std::__cxx11::u32string::_M_replace_dispatch<char8_t_const*>
                ((u32string *)out_string,pcVar7,pcVar7,"{}","");
      puVar5 = (uint *)pcVar6;
    }
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    push_back(out_string,L'{');
    if (*(__index_type *)
         ((long)&(in_object->m_value).
                 super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                 .
                 super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
         + 0x30) != '\a') {
      in_object = (object *)
                  &serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)
                   ::s_null_map_abi_cxx11_;
    }
    for (p_Var4 = *(_Rb_tree_node_base **)
                   ((long)&(in_object->m_value).
                           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           .
                           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   + 0x18);
        p_Var4 != (_Rb_tree_node_base *)
                  ((long)&(in_object->m_value).
                          super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                          .
                          super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                  + 8U); p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      in_string_00._M_str = (char8_t *)puVar5;
      in_string_00._M_len = *(size_t *)(p_Var4 + 1);
      make_json_string<char32_t,char32_t>
                ((jessilib *)out_string,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 p_Var4[1]._M_parent,in_string_00);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(out_string,L':');
      serialize_impl<char32_t,char32_t>(this,out_string,(object *)(p_Var4 + 2));
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(out_string,L',');
    }
    (out_string->_M_dataplus)._M_p[out_string->_M_string_length - 1] = L'}';
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    uVar8 = local_68.field_2._M_allocated_capacity * 4 + 4;
LAB_001690ba:
    operator_delete(local_68._M_dataplus._M_p,uVar8);
  }
  return;
}

Assistant:

void json_parser::serialize_impl(std::basic_string<ResultCharT>& out_string, const object& in_object) {
	using namespace std::literals;
	static const object::array_type s_null_array;
	static const object::map_type s_null_map;

	switch (in_object.type()) {
		case object::type::null:
			simple_append<CharT, ResultCharT>(out_string, u8"null"sv);
			return;

		case object::type::boolean:
			if (in_object.get<bool>()) {
				simple_append<CharT, ResultCharT>(out_string, u8"true"sv);
				return;
			}
			simple_append<CharT, ResultCharT>(out_string, u8"false"sv);
			return;

		case object::type::integer:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<intmax_t>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<intmax_t>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::decimal:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<long double>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<long double>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::text:
			make_json_string<CharT, ResultCharT>(out_string, in_object.get<std::u8string>());
			return;

		case object::type::array: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"[]"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '[');

			// Serialize all objects in array
			for (auto& obj : in_object.get<object::array_type>(s_null_array)) {
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, obj);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with ']'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = ']';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, ']');
			}
			// else // not supported
			return;
		}

		case object::type::map: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"{}"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '{');

			// Serialize all objects in map
			for (auto& item : in_object.get<object::map_type>(s_null_map)) {
				make_json_string<CharT, ResultCharT>(out_string, item.first);
				simple_append<CharT, ResultCharT>(out_string, ':');
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, item.second);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with '}'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = '}';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, '}');
			}
			// else // not supported
			return;
		}

		default:
			throw std::invalid_argument{ "Invalid data type: " + std::to_string(static_cast<size_t>(in_object.type())) };
	}
}